

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepairResponsePdu.cpp
# Opt level: O3

int __thiscall DIS::RepairResponsePdu::getMarshalledSize(RepairResponsePdu *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = LogisticsFamilyPdu::getMarshalledSize(&this->super_LogisticsFamilyPdu);
  iVar2 = EntityID::getMarshalledSize(&this->_receivingEntityID);
  iVar3 = EntityID::getMarshalledSize(&this->_repairingEntityID);
  return iVar3 + iVar2 + iVar1 + 4;
}

Assistant:

int RepairResponsePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = LogisticsFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _receivingEntityID.getMarshalledSize();  // _receivingEntityID
   marshalSize = marshalSize + _repairingEntityID.getMarshalledSize();  // _repairingEntityID
   marshalSize = marshalSize + 1;  // _repairResult
   marshalSize = marshalSize + 2;  // _padding1
   marshalSize = marshalSize + 1;  // _padding2
    return marshalSize;
}